

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O1

int __thiscall
CConsole::PossibleMaps(CConsole *this,char *pStr,FPossibleCallback pfnCallback,void *pUser)

{
  char *pcVar1;
  int iVar2;
  CMapListEntryTemp *pCVar3;
  
  pCVar3 = this->m_pFirstMapEntry;
  if (pCVar3 == (CMapListEntryTemp *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    do {
      pcVar1 = str_find_nocase(pCVar3->m_aName,pStr);
      if (pcVar1 != (char *)0x0) {
        (*pfnCallback)(iVar2,pCVar3->m_aName,pUser);
        iVar2 = iVar2 + 1;
      }
      pCVar3 = pCVar3->m_pNext;
    } while (pCVar3 != (CMapListEntryTemp *)0x0);
  }
  return iVar2;
}

Assistant:

int CConsole::PossibleMaps(const char *pStr, FPossibleCallback pfnCallback, void *pUser)
{
	int Index = 0;
	for(CMapListEntryTemp *pMapEntry = m_pFirstMapEntry; pMapEntry; pMapEntry = pMapEntry->m_pNext)
	{
		if(str_find_nocase(pMapEntry->m_aName, pStr))
		{
			pfnCallback(Index, pMapEntry->m_aName, pUser);
			Index++;
		}
	}
	return Index;
}